

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_search(connectdata *conn)

{
  void *pvVar1;
  IMAP *imap;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  if (*(long *)((long)pvVar1 + 0x38) == 0) {
    Curl_failf(conn->data,"Cannot SEARCH without a query string.");
    conn_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    conn_local._4_4_ = imap_sendf(conn,"SEARCH %s",*(undefined8 *)((long)pvVar1 + 0x38));
    if (conn_local._4_4_ == CURLE_OK) {
      state(conn,IMAP_SEARCH);
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_perform_search(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = conn->data->req.protop;

  /* Check we have a query string */
  if(!imap->query) {
    failf(conn->data, "Cannot SEARCH without a query string.");
    return CURLE_URL_MALFORMAT;
  }

  /* Send the SEARCH command */
  result = imap_sendf(conn, "SEARCH %s", imap->query);

  if(!result)
    state(conn, IMAP_SEARCH);

  return result;
}